

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
get_next_filled_position
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int pos,bool exclusive)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  long lVar4;
  ulong uVar5;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)pos;
  if ((int)CONCAT71(in_register_00000011,exclusive) != 0) {
    uVar2 = pos + 1;
    uVar3 = (ulong)uVar2;
    if (uVar2 == this->data_capacity_) {
      return uVar2;
    }
  }
  lVar4 = (long)((int)(uint)uVar3 >> 6);
  uVar5 = (this->bitmap_[lVar4] >> (uVar3 & 0x3f)) << (uVar3 & 0x3f);
  uVar2 = (uint)uVar3 & 0xffffffc0;
  while( true ) {
    lVar4 = lVar4 + 1;
    if (uVar5 != 0) {
      iVar1 = 0;
      for (; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      return iVar1 + uVar2;
    }
    if (this->bitmap_size_ <= lVar4) break;
    uVar5 = this->bitmap_[lVar4];
    uVar2 = uVar2 + 0x40;
  }
  return this->data_capacity_;
}

Assistant:

int get_next_filled_position(int pos, bool exclusive) const {
    if (exclusive) {
      pos++;
      if (pos == data_capacity_) {
        return data_capacity_;
      }
    }

    int curBitmapIdx = pos >> 6;
    uint64_t curBitmapData = bitmap_[curBitmapIdx];

    // Zero out extra bits
    int bit_pos = pos - (curBitmapIdx << 6);
    curBitmapData &= ~((1ULL << (bit_pos)) - 1);

    while (curBitmapData == 0) {
      curBitmapIdx++;
      if (curBitmapIdx >= bitmap_size_) {
        return data_capacity_;
      }
      curBitmapData = bitmap_[curBitmapIdx];
    }
    uint64_t bit = extract_rightmost_one(curBitmapData);
    return get_offset(curBitmapIdx, bit);
  }